

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_ulong.c
# Opt level: O1

uint fmt_ulong(char *s,unsigned_long u)

{
  bool bVar1;
  uint uVar2;
  unsigned_long q;
  byte *pbVar3;
  ulong uVar4;
  
  uVar2 = 1;
  uVar4 = u;
  if (9 < u) {
    do {
      uVar2 = uVar2 + 1;
      bVar1 = 99 < uVar4;
      uVar4 = uVar4 / 10;
    } while (bVar1);
  }
  if (s != (char *)0x0) {
    pbVar3 = (byte *)(s + uVar2);
    do {
      pbVar3 = pbVar3 + -1;
      *pbVar3 = (char)u + (char)(u / 10) * -10 | 0x30;
      bVar1 = 9 < u;
      u = u / 10;
    } while (bVar1);
  }
  return uVar2;
}

Assistant:

unsigned int fmt_ulong(register char *s,register unsigned long u)
{
  register unsigned int len; register unsigned long q;
  len = 1; q = u;
  while (q > 9) { ++len; q /= 10; }
  if (s) {
    s += len;
    do { *--s = '0' + (u % 10); u /= 10; } while(u); /* handles u == 0 */
  }
  return len;
}